

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_export_emit.cpp
# Opt level: O3

void __thiscall ExportEmitArray_Array_Test::TestBody(ExportEmitArray_Array_Test *this)

{
  pointer pcVar1;
  ostream_base *poVar2;
  string *psVar3;
  indent *__n;
  void *__buf;
  void *extraout_RDX;
  void *pvVar4;
  void *__buf_00;
  void *extraout_RDX_00;
  void *__buf_01;
  int iVar5;
  char *message;
  pointer piVar6;
  initializer_list<int> __l;
  string actual;
  vector<int,_std::allocator<int>_> values;
  ostringstream os;
  indent local_d8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  AssertHelper local_c8;
  Message local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  vector<int,_std::allocator<int>_> local_98;
  ostringstream local_80;
  
  __n = local_d8;
  pstore::exchange::export_ns::ostream_base::ostream_base(&local_80.super_ostream_base,0x1000);
  local_80.super_ostream_base._vptr_ostream_base = (_func_int **)&PTR__ostringstream_0023b498;
  local_80.str_._M_dataplus._M_p = (pointer)&local_80.str_.field_2;
  local_80.str_._M_string_length = 0;
  local_80.str_.field_2._M_local_buf[0] = '\0';
  local_b8._M_dataplus._M_p = (pointer)0x300000002;
  local_b8._M_string_length._0_4_ = 5;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_b8;
  std::vector<int,_std::allocator<int>_>::vector(&local_98,__l,(allocator_type *)local_d8);
  piVar6 = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  local_d8[0].distance_ = 0;
  pstore::exchange::export_ns::ostream_base::write
            (&local_80.super_ostream_base,0x1e84ac,__buf,(size_t)__n);
  iVar5 = 0x1e6b3f;
  pvVar4 = extraout_RDX;
  if (piVar6 != local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      poVar2 = (ostream_base *)
               pstore::exchange::export_ns::ostream_base::write
                         (&local_80.super_ostream_base,iVar5,pvVar4,(size_t)__n);
      pstore::exchange::export_ns::ostream_base::write(poVar2,10,__buf_00,(size_t)__n);
      iVar5 = *piVar6;
      local_b8._M_dataplus._M_p._0_4_ = 1;
      poVar2 = pstore::exchange::export_ns::operator<<
                         (&local_80.super_ostream_base,(indent *)&local_b8);
      pstore::exchange::export_ns::ostream_base::write<int,void,void>(poVar2,iVar5);
      local_d8[0].distance_ = 0;
      piVar6 = piVar6 + 1;
      pvVar4 = extraout_RDX_00;
      iVar5 = 0x1dce9a;
    } while (piVar6 != local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    iVar5 = 0x1e6b3e;
  }
  poVar2 = (ostream_base *)
           pstore::exchange::export_ns::ostream_base::write
                     (&local_80.super_ostream_base,iVar5,pvVar4,(size_t)__n);
  poVar2 = pstore::exchange::export_ns::operator<<(poVar2,local_d8);
  pstore::exchange::export_ns::ostream_base::write(poVar2,0x1dce98,__buf_01,(size_t)__n);
  psVar3 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_(&local_80);
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar1,pcVar1 + psVar3->_M_string_length);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[18]>
            ((internal *)local_d8,"actual","\"[\\n  2,\\n  3,\\n  5\\n]\"",&local_b8,
             (char (*) [18])"[\n  2,\n  3,\n  5\n]");
  if (local_d8[0].distance_._0_1_ == (allocator_type)0x0) {
    testing::Message::Message(&local_c0);
    if (local_d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_export_emit.cpp"
               ,0x56,message);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_c0.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_c0.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pstore::exchange::export_ns::ostringstream::~ostringstream(&local_80);
  return;
}

Assistant:

TEST (ExportEmitArray, Array) {
    pstore::exchange::export_ns::ostringstream os;
    std::vector<int> values{2, 3, 5};
    emit_array (os, pstore::exchange::export_ns::indent{}, std::begin (values), std::end (values),
                [] (pstore::exchange::export_ns::ostringstream & os1,
                    pstore::exchange::export_ns::indent ind, int v) { os1 << ind << v; });
    auto const actual = os.str ();
    EXPECT_EQ (actual, "[\n  2,\n  3,\n  5\n]");
}